

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

uint8 * __thiscall
sentencepiece::NormalizerSpec::_InternalSerialize
          (NormalizerSpec *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint32 uVar2;
  uint8 *puVar3;
  EpsCopyOutputStream *in_RDX;
  uint8 *in_RSI;
  NormalizerSpec *in_RDI;
  uint32 cached_has_bits;
  NormalizerSpec *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  EpsCopyOutputStream *in_stack_fffffffffffffe78;
  InternalMetadata *this_00;
  int size;
  EpsCopyOutputStream *in_stack_fffffffffffffe80;
  EpsCopyOutputStream *pEVar4;
  uint8 *in_stack_fffffffffffffe88;
  EpsCopyOutputStream *pEVar5;
  string *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  uint32 num;
  EpsCopyOutputStream *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb0;
  uint uVar6;
  NormalizerSpec *this_01;
  
  num = (uint32)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  uVar6 = (in_RDI->_has_bits_).has_bits_[0];
  pEVar4 = in_RDX;
  this_01 = in_RDI;
  if ((uVar6 & 1) != 0) {
    _internal_name_abi_cxx11_(in_stack_fffffffffffffe68);
    in_RSI = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (in_RDX,num,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    in_stack_fffffffffffffea0 = in_RDX;
  }
  pEVar5 = pEVar4;
  if ((uVar6 & 2) != 0) {
    _internal_precompiled_charsmap_abi_cxx11_(in_stack_fffffffffffffe68);
    num = (uint32)((ulong)pEVar4 >> 0x20);
    in_RSI = google::protobuf::io::EpsCopyOutputStream::WriteBytesMaybeAliased
                       (in_stack_fffffffffffffe80,(uint32)((ulong)in_stack_fffffffffffffe78 >> 0x20)
                        ,in_stack_fffffffffffffe70,(uint8 *)in_stack_fffffffffffffe68);
  }
  if ((uVar6 & 8) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                       (in_stack_fffffffffffffe78,(uint8 *)in_stack_fffffffffffffe70);
    bVar1 = _internal_add_dummy_prefix(in_RDI);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(3,WIRETYPE_VARINT);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    in_RSI = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar3);
  }
  if ((uVar6 & 0x10) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                       (in_stack_fffffffffffffe78,(uint8 *)in_stack_fffffffffffffe70);
    bVar1 = _internal_remove_extra_whitespaces(in_RDI);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(4,WIRETYPE_VARINT);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    in_RSI = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar3);
  }
  if ((uVar6 & 0x20) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                       (in_stack_fffffffffffffe78,(uint8 *)in_stack_fffffffffffffe70);
    bVar1 = _internal_escape_whitespaces(in_RDI);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(5,WIRETYPE_VARINT);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    in_RSI = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar3);
  }
  pEVar4 = pEVar5;
  if ((uVar6 & 4) != 0) {
    _internal_normalization_rule_tsv_abi_cxx11_(in_stack_fffffffffffffe68);
    in_RSI = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (in_stack_fffffffffffffea0,num,(string *)pEVar5,in_stack_fffffffffffffe88);
  }
  puVar3 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     ((ExtensionSet *)this_01,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                      (uint8 *)pEVar4,
                      (EpsCopyOutputStream *)CONCAT44(uVar6,in_stack_fffffffffffffeb0));
  if (((uint)(in_RDI->super_MessageLite)._internal_metadata_.ptr_ & 1) == 1) {
    pEVar5 = (EpsCopyOutputStream *)&(in_RDI->super_MessageLite)._internal_metadata_;
    if (((uint)((InternalMetadata *)pEVar5)->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                ((InternalMetadata *)pEVar5);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    puVar3 = (uint8 *)std::__cxx11::string::data();
    this_00 = &(in_RDI->super_MessageLite)._internal_metadata_;
    if (((uint)this_00->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (this_00);
      size = (int)((ulong)this_00 >> 0x20);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
      size = (int)((ulong)this_00 >> 0x20);
    }
    std::__cxx11::string::size();
    puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRaw(pEVar5,pEVar4,size,puVar3);
  }
  return puVar3;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* NormalizerSpec::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.NormalizerSpec)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional bytes precompiled_charsmap = 2;
  if (cached_has_bits & 0x00000002u) {
    target = stream->WriteBytesMaybeAliased(
        2, this->_internal_precompiled_charsmap(), target);
  }

  // optional bool add_dummy_prefix = 3 [default = true];
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_add_dummy_prefix(), target);
  }

  // optional bool remove_extra_whitespaces = 4 [default = true];
  if (cached_has_bits & 0x00000010u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(4, this->_internal_remove_extra_whitespaces(), target);
  }

  // optional bool escape_whitespaces = 5 [default = true];
  if (cached_has_bits & 0x00000020u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(5, this->_internal_escape_whitespaces(), target);
  }

  // optional string normalization_rule_tsv = 6;
  if (cached_has_bits & 0x00000004u) {
    target = stream->WriteStringMaybeAliased(
        6, this->_internal_normalization_rule_tsv(), target);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.NormalizerSpec)
  return target;
}